

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

_Bool mul_u16n(uint16_t *r,uint16_t *a,uint16_t *b,size_t nr,size_t na,size_t nb)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint local_70;
  uint32_t t;
  uint32_t carry;
  uint32_t p;
  size_t ir;
  size_t rir;
  size_t ib;
  size_t sStack_48;
  _Bool over;
  size_t ia;
  uint32_t mask;
  size_t nb_local;
  size_t na_local;
  size_t nr_local;
  uint16_t *b_local;
  uint16_t *a_local;
  uint16_t *r_local;
  
  ib._7_1_ = false;
  zer_u16n(r,nr);
  sStack_48 = na;
LAB_0026d5c0:
  do {
    if (sStack_48 == 0) {
      return ib._7_1_;
    }
    sStack_48 = sStack_48 - 1;
    rir = nb;
LAB_0026d5df:
  } while (rir == 0);
  uVar4 = ((na - 1) - sStack_48) + (nb - rir);
  if (nr <= uVar4) {
    ib._7_1_ = true;
    goto LAB_0026d5c0;
  }
  rir = rir - 1;
  _carry = (nr - uVar4) + -1;
  uVar1 = a[sStack_48];
  uVar2 = b[rir];
  uVar3 = (uint)r[_carry] + ((uint)uVar1 * (uint)uVar2 & 0xffff);
  r[_carry] = (uint16_t)uVar3;
  for (local_70 = (uVar3 >> 0x10) + ((uint)uVar1 * (uint)uVar2 >> 0x10); local_70 != 0;
      local_70 = uVar1 + local_70 >> 0x10) {
    if (_carry == 0) {
      ib._7_1_ = true;
      break;
    }
    _carry = _carry + -1;
    uVar1 = r[_carry];
    r[_carry] = (uint16_t)(uVar1 + local_70);
  }
  goto LAB_0026d5df;
}

Assistant:

static bool mul_u16n(uint16_t *r, const uint16_t *a, const uint16_t *b,
		size_t nr, size_t na, size_t nb)
{
	const uint32_t mask = ((uint32_t)1 << 16) - 1;
	size_t ia = na;
	bool over = false;

	zer_u16n(r, nr);
	while (ia > 0) {
		size_t ib = nb;

		--ia;
		while (ib > 0) {
			size_t rir = (na - 1 - ia) + (nb - ib), ir;
			uint32_t p, carry, t;

			if (rir >= nr) {
				over = true;
				break;
			}
			--ib;
			ir = (nr - rir) - 1;
			p = (uint32_t)a[ia] * (uint32_t)b[ib];
			carry = p >> 16;
			t = (uint32_t)r[ir] + (p & mask);
			r[ir] = t & mask;
			carry += t >> 16;
			while (carry > 0) {
				if (ir == 0) {
					over = true;
					break;
				}
				--ir;
				t = (uint32_t)r[ir] + carry;
				r[ir] = t & mask;
				carry = t >> 16;
			}
		}
	}
	return over;
}